

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_bignum
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  bool bVar1;
  uint uVar2;
  string_view_type sVar3;
  string_view_type sVar4;
  
  while (uVar2 = *(byte *)&this->field_0 & 0xf, uVar2 == 9) {
    this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
            ((long)&this->field_0 + 8);
  }
  if (uVar2 - 2 < 2) {
    bVar1 = true;
  }
  else {
    if ((uVar2 == 0xf) || (uVar2 == 7)) {
      sVar3 = as_string_view(this);
      sVar4 = as_string_view(this);
      bVar1 = detail::is_base10<char>(sVar3._M_str,sVar4._M_len);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool is_bignum() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return jsoncons::detail::is_base10(as_string_view().data(), as_string_view().length());
                case json_storage_kind::int64:
                case json_storage_kind::uint64:
                    return true;
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_bignum();
                default:
                    return false;
            }
        }